

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_handler.cc
# Opt level: O3

void __thiscall
helix::nasdaq::itch50_handler::subscribe(itch50_handler *this,string *sym,size_t max_orders)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  long lVar3;
  double dVar4;
  undefined1 auVar5 [16];
  size_t local_18;
  
  uVar1 = sym->_M_string_length;
  local_18 = max_orders;
  if (uVar1 != 8) {
    std::__cxx11::string::insert((ulong)sym,uVar1,'\b' - (char)uVar1);
  }
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->_symbols,sym);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::__cxx11::string&,unsigned_long&>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->_symbol_max_orders,sym,&local_18);
  p_Var2 = (this->_symbol_max_orders)._M_h._M_before_begin._M_nxt;
  if (p_Var2 == (_Hash_node_base *)0x0) {
    dVar4 = 0.0;
  }
  else {
    lVar3 = 0;
    do {
      lVar3 = (long)&(p_Var2[5]._M_nxt)->_M_nxt + lVar3;
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
    auVar5._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar5._0_8_ = lVar3;
    auVar5._12_4_ = 0x45300000;
    dVar4 = (auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0);
  }
  dVar4 = ceil(dVar4 / (double)(this->order_book_id_map)._M_h._M_rehash_policy._M_max_load_factor);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_helix::order_book>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::rehash(&(this->order_book_id_map)._M_h,
           (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4);
  return;
}

Assistant:

void itch50_handler::subscribe(std::string sym, size_t max_orders) {
    auto padding = ITCH_SYMBOL_LEN - sym.size();
    if (padding > 0) {
        sym.insert(sym.size(), padding, ' ');
    }
    _symbols.insert(sym);
    _symbol_max_orders.emplace(sym, max_orders);
    size_t max_all_orders = 0;
    for (auto&& kv : _symbol_max_orders) {
        max_all_orders += kv.second;
    }
    order_book_id_map.reserve(max_all_orders);
}